

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpoolheap.h
# Opt level: O2

void __thiscall
Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>::ThreadPoolHeap
          (ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap> *this)

{
  int i;
  long lVar1;
  
  LockMallocHeap<Hoard::SmallHeap>::LockMallocHeap((LockMallocHeap<Hoard::SmallHeap> *)this);
  Array<128UL,_Hoard::PerThreadHoardHeap>::Array(&this->_heap);
  for (lVar1 = 0; lVar1 != 0x800; lVar1 = lVar1 + 1) {
    (this->_tidMap)._item[lVar1] = (uint)lVar1 & 0x7f;
  }
  return;
}

Assistant:

ThreadPoolHeap()
    {
      static_assert((NumHeaps & NumHeapsMask) == 0,
		    "Number of heaps must be a power of two.");
      static_assert((NumThreads & NumThreadsMask) == 0,
		    "Number of threads must be a power of two.");
    
      // Note: The tidmap values should be set externally.
      int j = 0;
      for (int i = 0; i < NumThreads; i++) {
	setTidMap(i, j % NumHeaps);
	j++;
      }
    }